

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadSafeFramesQueue.hpp
# Opt level: O0

bool __thiscall ThreadSafeFramesQueue<cv::Mat>::Pop(ThreadSafeFramesQueue<cv::Mat> *this,Mat *out)

{
  bool bVar1;
  reference pvVar2;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lock;
  Mat *out_local;
  ThreadSafeFramesQueue<cv::Mat> *this_local;
  
  lock._M_device = (mutex_type *)out;
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->mtx);
  bVar1 = std::queue<cv::Mat,_std::deque<cv::Mat,_std::allocator<cv::Mat>_>_>::empty
                    (&this->super_queue<cv::Mat,_std::deque<cv::Mat,_std::allocator<cv::Mat>_>_>);
  if (!bVar1) {
    pvVar2 = std::queue<cv::Mat,_std::deque<cv::Mat,_std::allocator<cv::Mat>_>_>::front
                       (&this->super_queue<cv::Mat,_std::deque<cv::Mat,_std::allocator<cv::Mat>_>_>)
    ;
    cv::Mat::operator=((Mat *)lock._M_device,pvVar2);
    std::queue<cv::Mat,_std::deque<cv::Mat,_std::allocator<cv::Mat>_>_>::pop
              (&this->super_queue<cv::Mat,_std::deque<cv::Mat,_std::allocator<cv::Mat>_>_>);
    cv::TickMeter::stop(&this->tm);
    cv::TickMeter::start(&this->tm);
  }
  this_local._7_1_ = !bVar1;
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return this_local._7_1_;
}

Assistant:

bool Pop(T& out) noexcept {
    std::lock_guard<std::mutex> lock(mtx);
    //! if the queue is empty, just exit
    if (this->empty()) {
      return false;
    }
    //! get the first element, and remove it
    out = this->front();
    this->pop();
    //! stop the current timer
    tm.stop();
    //! start the next timer
    tm.start();
    //! return true, indicating successful pop
    return true;
  }